

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontDescriptorWriter.cpp
# Opt level: O2

uint __thiscall
FontDescriptorWriter::CalculateFlags
          (FontDescriptorWriter *this,FreeTypeFaceWrapper *inFontInfo,
          UIntAndGlyphEncodingInfoVector *inEncodedGlyphs)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  FreeTypeFaceWrapper *this_00;
  uint uVar5;
  
  bVar3 = FreeTypeFaceWrapper::IsFixedPitch(inFontInfo);
  this_00 = inFontInfo;
  bVar4 = FreeTypeFaceWrapper::IsSerif(inFontInfo);
  uVar5 = bVar3 + 2;
  if (!bVar4) {
    uVar5 = (uint)bVar3;
  }
  bVar3 = IsSymbolic((FontDescriptorWriter *)this_00,inFontInfo,inEncodedGlyphs);
  iVar1 = 0x20;
  if (bVar3) {
    iVar1 = 4;
  }
  bVar3 = FreeTypeFaceWrapper::IsScript(inFontInfo);
  uVar2 = iVar1 + uVar5 + 8;
  if (!bVar3) {
    uVar2 = uVar5 + iVar1;
  }
  bVar3 = FreeTypeFaceWrapper::IsItalic(inFontInfo);
  uVar5 = uVar2 | 0x40;
  if (!bVar3) {
    uVar5 = uVar2;
  }
  bVar3 = FreeTypeFaceWrapper::IsForceBold(inFontInfo);
  uVar2 = uVar5 | 0x40000;
  if (!bVar3) {
    uVar2 = uVar5;
  }
  return uVar2;
}

Assistant:

unsigned int FontDescriptorWriter::CalculateFlags(	FreeTypeFaceWrapper* inFontInfo,
													const UIntAndGlyphEncodingInfoVector& inEncodedGlyphs)
{
	unsigned int flags = 0;

	// see FreeTypeFaceWrapper::GetFontFlags for explanation, if you must

	if(inFontInfo->IsFixedPitch())
		flags |= 1;
	if(inFontInfo->IsSerif())
		flags |= 2;
	if(IsSymbolic(inFontInfo,inEncodedGlyphs))
		flags |= 4;
	else
		flags |= 32;
	if(inFontInfo->IsScript())
		flags |= 8;
	if(inFontInfo->IsItalic())
		flags |= 64;
	if(inFontInfo->IsForceBold())
		flags |= (1<<18);

	return flags;
	
}